

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::GetReferenceIndexVec
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,
          TPZManVector<TPZCompMesh_*,_10> *cmeshVec,
          set<long,_std::less<long>,_std::allocator<long>_> *refIndexVec)

{
  int iVar1;
  TPZCompEl **ppTVar2;
  TPZGeoEl *pTVar3;
  TPZGeoElSide *this_00;
  long lVar4;
  int64_t j;
  long nelem;
  long lVar5;
  long lVar6;
  int64_t local_f8;
  TPZStack<TPZCompElSide,_10> sidevec;
  
  if ((cmeshVec->super_TPZVec<TPZCompMesh_*>).fNElements != 0) {
    TPZGeoMesh::ResetReference((*(cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore)->fReference);
    lVar6 = (cmeshVec->super_TPZVec<TPZCompMesh_*>).fNElements;
    lVar4 = 0;
    if (lVar6 < 1) {
      lVar6 = lVar4;
    }
    for (; lVar6 != lVar4; lVar4 = lVar4 + 1) {
      TPZCompMesh::LoadReferences((cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore[lVar4]);
    }
    TPZStack<TPZCompElSide,_10>::TPZStack(&sidevec);
    for (lVar4 = 0; lVar4 != lVar6; lVar4 = lVar4 + 1) {
      lVar5 = ((cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore[lVar4]->fElementVec).
              super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      if (lVar5 < 1) {
        lVar5 = 0;
      }
      for (nelem = 0; lVar5 != nelem; nelem = nelem + 1) {
        ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&((cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore[lVar4]->fElementVec).
                              super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
        if (*ppTVar2 != (TPZCompEl *)0x0) {
          pTVar3 = TPZCompEl::Reference(*ppTVar2);
          iVar1 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
          this_00 = (TPZGeoElSide *)operator_new(0x18);
          (this_00->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          this_00->fGeoEl = pTVar3;
          this_00->fSide = iVar1 + -1;
          TPZManVector<TPZCompElSide,_10>::Resize(&sidevec.super_TPZManVector<TPZCompElSide,_10>,0);
          TPZGeoElSide::HigherLevelCompElementList2(this_00,&sidevec,1,1);
          if (sidevec.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements
              == 0) {
            local_f8 = pTVar3->fIndex;
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::_M_insert_unique<long>(&refIndexVec->_M_t,&local_f8);
          }
        }
      }
    }
    TPZManVector<TPZCompElSide,_10>::~TPZManVector(&sidevec.super_TPZManVector<TPZCompElSide,_10>);
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::GetReferenceIndexVec(TPZManVector<TPZCompMesh *> cmeshVec, std::set<int64_t> &refIndexVec){
    
    if(cmeshVec.NElements() == 0) return;
    TPZCompMesh *cmesh = cmeshVec[0];
    TPZGeoMesh *gmesh = cmesh->Reference();
    gmesh->ResetReference();
    int64_t isub;
    int64_t ncm = cmeshVec.NElements();
    for (isub=0; isub<ncm; isub++) {
        cmeshVec[isub]->LoadReferences();
    }
    int64_t ncel;
    TPZStack<TPZCompElSide> sidevec;
    for(int64_t i = 0; i< ncm; i++){
        ncel = cmeshVec[i]->NElements();
        for (int64_t j=0; j<ncel; j++) {
            TPZCompEl * cel = cmeshVec[i]->ElementVec()[j];
            if(cel){
                TPZGeoEl *geoel = cel->Reference();
                
#ifdef PZDEBUG
                if (!geoel){
                    PZError << "Error at " << __PRETTY_FUNCTION__ << " Geometry element null!\n";
                    DebugStop();
                }
#endif
                
                int ns = geoel->NSides();
                TPZGeoElSide *geoside = new TPZGeoElSide(geoel,ns-1);
                sidevec.Resize(0);
                geoside->HigherLevelCompElementList2(sidevec, 1,1);
                int64_t nel = sidevec.NElements();
                if (nel==0){
                    //std::cout << "Incluindo elemento " << geoel->Index() << std::endl;
                    refIndexVec.insert(geoel->Index());
                }
            }
        }
    }
    
    
#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "Number of elements : " << refIndexVec.size() << std::endl;
        sout <<"Reference index of elements : "<< std::endl;
        std::set<int64_t>::iterator it;
        for (it=refIndexVec.begin() ; it != refIndexVec.end(); it++ )
            sout << " " << *it;
        sout << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
}